

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  byte bVar1;
  uint8_t uVar2;
  int i;
  uint uVar3;
  long lVar4;
  grasshopper_w128_t *source;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  grasshopper_w128_t tmp;
  uint64_t local_48 [3];
  
  lVar4 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar3 = EVP_CIPHER_CTX_get_num(ctx);
  sVar6 = inl;
  sVar7 = inl;
  if (inl != 0 && uVar3 != 0) {
    do {
      bVar1 = *in;
      in = in + 1;
      *out = *(byte *)(lVar4 + 0x198 + (ulong)uVar3) ^ bVar1;
      out = out + 1;
      sVar7 = sVar6 - 1;
      uVar3 = uVar3 + 1 & 0xf;
      if (uVar3 == 0) break;
      bVar9 = sVar6 != 1;
      sVar6 = sVar7;
    } while (bVar9);
  }
  EVP_CIPHER_CTX_set_num(ctx,uVar3);
  if (0xf < sVar7) {
    uVar8 = 0;
    do {
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)(lVar4 + 0x48),source,
                 (grasshopper_w128_t *)(lVar4 + 0x198),(grasshopper_w128_t *)(lVar4 + 0x188));
      local_48[0] = ((grasshopper_w128_t *)(lVar4 + 0x198))->q[0];
      local_48[1] = *(undefined8 *)(lVar4 + 0x1a0);
      lVar5 = 0;
      do {
        local_48[lVar5] = local_48[lVar5] ^ *(ulong *)(in + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      lVar5 = 0;
      do {
        *(uint64_t *)(out + lVar5 * 8) = local_48[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      lVar5 = 0xf;
      do {
        uVar2 = source->b[lVar5];
        source->b[lVar5] = uVar2 + '\x01';
        bVar9 = lVar5 == 0;
        lVar5 = lVar5 + -1;
        if (bVar9) break;
      } while ((uint8_t)(uVar2 + '\x01') == '\0');
      in = in + 0x10;
      out = out + 0x10;
      uVar8 = uVar8 + 1;
    } while (uVar8 != sVar7 >> 4);
    sVar7 = (size_t)((uint)sVar7 & 0xf);
  }
  if (sVar7 != 0) {
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar4 + 0x48),source,
               (grasshopper_w128_t *)(lVar4 + 0x198),(grasshopper_w128_t *)(lVar4 + 0x188));
    uVar8 = 0;
    do {
      out[uVar8] = in[uVar8] ^ ((grasshopper_w128_t *)(lVar4 + 0x198))->b[uVar8];
      uVar8 = uVar8 + 1;
    } while (sVar7 != uVar8);
    EVP_CIPHER_CTX_set_num(ctx,sVar7 & 0xffffffff);
    lVar4 = 0xf;
    do {
      uVar2 = source->b[lVar4];
      source->b[lVar4] = uVar2 + '\x01';
      bVar9 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar9) break;
    } while ((uint8_t)(uVar2 + '\x01') == '\0');
  }
  return (int)inl;
}

Assistant:

static int gost_grasshopper_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = (gost_grasshopper_cipher_ctx_ctr *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    grasshopper_w128_t *currentInputBlock;
    grasshopper_w128_t *currentOutputBlock;
    unsigned int n = EVP_CIPHER_CTX_num(ctx);
    size_t lasted = inl;
    size_t i;
    size_t blocks;
    grasshopper_w128_t *iv_buffer;
    grasshopper_w128_t tmp;

    while (n && lasted) {
        *(current_out++) = *(current_in++) ^ c->partial_buffer.b[n];
        --lasted;
        n = (n + 1) % GRASSHOPPER_BLOCK_SIZE;
    }
    EVP_CIPHER_CTX_set_num(ctx, n);
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    iv_buffer = (grasshopper_w128_t *) iv;

    // full parts
    for (i = 0; i < blocks; i++) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer, currentInputBlock);
        grasshopper_copy128(currentOutputBlock, &tmp);
        ctr128_inc(iv_buffer->b);
        current_in += GRASSHOPPER_BLOCK_SIZE;
        current_out += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    if (lasted > 0) {
        currentInputBlock = (grasshopper_w128_t *) current_in;
        currentOutputBlock = (grasshopper_w128_t *) current_out;
        grasshopper_encrypt_block(&c->c.encrypt_round_keys, iv_buffer,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++) {
            currentOutputBlock->b[i] =
                c->partial_buffer.b[i] ^ currentInputBlock->b[i];
        }
        EVP_CIPHER_CTX_set_num(ctx, i);
        ctr128_inc(iv_buffer->b);
    }

    return inl;
}